

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O2

void bk_lib::detail::fill<Potassco::RuleBuilder*>
               (RuleBuilder **first,RuleBuilder **last,RuleBuilder **x)

{
  RuleBuilder *pRVar1;
  
  switch((uint)((int)last - (int)first) >> 3 & 7) {
  case 0:
    for (; first != last; first = first + 1) {
      pRVar1 = *x;
      *first = pRVar1;
      first = first + 1;
LAB_00141f81:
      *first = pRVar1;
      first = first + 1;
switchD_00141f5c_caseD_6:
      pRVar1 = *x;
      *first = pRVar1;
      first = first + 1;
LAB_00141f92:
      *first = pRVar1;
      first = first + 1;
switchD_00141f5c_caseD_4:
      pRVar1 = *x;
      *first = pRVar1;
      first = first + 1;
LAB_00141fa3:
      *first = pRVar1;
      first = first + 1;
switchD_00141f5c_caseD_2:
      pRVar1 = *x;
      *first = pRVar1;
      first = first + 1;
LAB_00141fb4:
      *first = pRVar1;
    }
    break;
  case 1:
    pRVar1 = *x;
    goto LAB_00141fb4;
  case 2:
    goto switchD_00141f5c_caseD_2;
  case 3:
    pRVar1 = *x;
    goto LAB_00141fa3;
  case 4:
    goto switchD_00141f5c_caseD_4;
  case 5:
    pRVar1 = *x;
    goto LAB_00141f92;
  case 6:
    goto switchD_00141f5c_caseD_6;
  case 7:
    pRVar1 = *x;
    goto LAB_00141f81;
  }
  return;
}

Assistant:

void fill(T* first, T* last, const T& x) {
		assert(first <= last);
		switch ((last - first) & 7u)
		{
		case 0:
				while (first != last)
				{
				new(first++) T(x);
		case 7: new(first++) T(x);
		case 6: new(first++) T(x);
		case 5: new(first++) T(x);
		case 4: new(first++) T(x);
		case 3: new(first++) T(x);
		case 2: new(first++) T(x);
		case 1: new(first++) T(x);
				assert(first <= last);
				}
		}
	}